

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O1

void __thiscall
ExampleNLFeeder::FeedRowAndObjNames<mp::StringFileWriter>
          (ExampleNLFeeder *this,StringFileWriter *wrt)

{
  int i;
  long lVar1;
  bool bVar2;
  
  if (wrt->fTriedOpen_ == false) {
    bVar2 = mp::StringFileWriter::Open(wrt);
  }
  else {
    bVar2 = (wrt->nm).f_ != (FILE *)0x0;
  }
  if (bVar2 != false) {
    lVar1 = 0;
    do {
      mp::StringFileWriter::Write<char_const*>(wrt,this->mdl_->con_name[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    mp::StringFileWriter::Write<char_const*>(wrt,this->mdl_->obj_name);
    return;
  }
  return;
}

Assistant:

void FeedRowAndObjNames(RowObjNameWriter& wrt) {
    if (wrt) {     // && output_desired
      for (int i=0; i<Model().n_con; ++i)
        wrt << Model().con_name[i];
      wrt << Model().obj_name;
    }
  }